

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

Const_Proxy_Function __thiscall
chaiscript::bootstrap::Bootstrap::get_guard(Bootstrap *this,Const_Proxy_Function *t_pf)

{
  bool bVar1;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Const_Proxy_Function CVar2;
  bool local_5d;
  undefined1 local_50 [24];
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> pf;
  Const_Proxy_Function *t_pf_local;
  
  pf.
  super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_pf;
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base_const>
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  local_50[0x17] = 0;
  local_5d = false;
  if (bVar1) {
    std::
    __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_28);
    dispatch::Dynamic_Proxy_Function::get_guard((Dynamic_Proxy_Function *)local_38);
    local_50[0x17] = 1;
    local_5d = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  }
  if ((local_50[0x17] & 1) != 0) {
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_38);
  }
  if (local_5d != false) {
    std::
    __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_28);
    dispatch::Dynamic_Proxy_Function::get_guard((Dynamic_Proxy_Function *)local_50);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::
    shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const> *)this,
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_50);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_50);
    std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
              ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)local_28);
    CVar2.
    super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    CVar2.
    super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Const_Proxy_Function)
           CVar2.
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Function does not have a guard");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Const_Proxy_Function get_guard(const Const_Proxy_Function &t_pf) {
      const auto pf = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_pf);
      if (pf && pf->get_guard()) {
        return pf->get_guard();
      } else {
        throw std::runtime_error("Function does not have a guard");
      }
    }